

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::DiffComplex<KVEntryString>::printJson
          (DiffComplex<KVEntryString> *this,size_t index,PrintIndent *out,int indent,char *space,
          char *nl)

{
  undefined4 in_stack_00000018;
  
  std::optional<KVEntryString>::operator->((optional<KVEntryString> *)0x17005b);
  CommandCompare::compareKVEntry(ktx::PrintDiff&,std::basic_string_view<char,std::
  char_traits<char>>const&,ktxKVListEntry*,ktxKVListEntry*)::KVEntryString::printJson(ktx::
  PrintIndent__int_char_const__char_const___const
            ((KVEntryString *)this,(PrintIndent *)index,out._4_4_,
             (char *)CONCAT44(indent,in_stack_00000018),space);
  return;
}

Assistant:

void printJson(std::size_t index, PrintIndent& out, int indent, const char* space, const char* nl) const {
        values[index]->printJson(out, indent, space, nl);
    }